

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewScFunc(Lowerer *this,Instr *newScFuncInstr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegOpnd *this_00;
  undefined4 *puVar4;
  Instr *pIVar5;
  IntConstOpnd *functionBodySlotOpnd;
  Instr *pIVar6;
  RegOpnd *local_38;
  RegOpnd *envOpnd;
  
  this_00 = (RegOpnd *)IR::Instr::UnlinkSrc2(newScFuncInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005a30c2;
    *puVar4 = 0;
  }
  local_38 = this_00;
  if (newScFuncInstr->m_func->stackNestedFunc == true) {
    pIVar5 = GenerateNewStackScFunc(this,newScFuncInstr,&local_38);
  }
  else {
    pIVar5 = (Instr *)0x0;
  }
  functionBodySlotOpnd = (IntConstOpnd *)IR::Instr::UnlinkSrc1(newScFuncInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)functionBodySlotOpnd);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) {
LAB_005a30c2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar6 = LoadFunctionBodyAsArgument(this,newScFuncInstr,functionBodySlotOpnd,local_38);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,newScFuncInstr,HelperScrFunc_OP_NewScFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  if (pIVar5 != (Instr *)0x0) {
    pIVar6 = pIVar5;
  }
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScFunc(IR::Instr * newScFuncInstr)
{
    IR::Instr *stackNewScFuncInstr = nullptr;
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    if (newScFuncInstr->m_func->DoStackNestedFunc())
    {
        stackNewScFuncInstr = GenerateNewStackScFunc(newScFuncInstr, &envOpnd);
    }

    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScFunc );

    return stackNewScFuncInstr == nullptr? instrPrev : stackNewScFuncInstr;
}